

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

Vec2f __thiscall Model::uv(Model *this,int fi,int li)

{
  Vec2f VVar1;
  Model *pMVar2;
  uint in_ECX;
  undefined4 in_register_00000034;
  long lVar3;
  float in_XMM0_Da;
  float in_XMM0_Db;
  
  lVar3 = CONCAT44(in_register_00000034,fi);
  if (((-1 < li) && (in_ECX < 3)) &&
     (li < (int)((ulong)(*(long *)(lVar3 + 0x20) - *(long *)(lVar3 + 0x18)) >> 3) * -0x55555555)) {
    pMVar2 = (Model *)((long)*(int *)(*(long *)(*(long *)(lVar3 + 0x18) + (ulong)(uint)li * 0x18) +
                                      4 + (ulong)in_ECX * 0xc) * 8 + *(long *)(lVar3 + 0x48));
    (this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (pMVar2 != this) {
      *(undefined4 *)
       &(this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
        super__Vector_impl_data._M_start =
           *(undefined4 *)
            &(pMVar2->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
      in_XMM0_Da = *(float *)((long)&(pMVar2->verts).
                                     super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 4);
      in_XMM0_Db = 0.0;
      *(float *)((long)&(this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) = in_XMM0_Da;
    }
    VVar1.y = in_XMM0_Db;
    VVar1.x = in_XMM0_Da;
    return VVar1;
  }
  __assert_fail("fi>=0 && fi<nfaces() && li>=0 && li<3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                ,0x57,"Vec2f Model::uv(int, int)");
}

Assistant:

Vec2f Model::uv(int fi, int li) {
    assert(fi>=0 && fi<nfaces() && li>=0 && li<3);
    return texcoords[faces[fi][li].y];
}